

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O2

void __thiscall DBOPL::Operator::UpdateRates(Operator *this,Chip *chip)

{
  uint uVar1;
  
  uVar1 = this->chanData >> (((this->reg20 & 0x10) == 0) * '\x02' | 0x18U);
  if (uVar1 == this->ksr) {
    return;
  }
  this->ksr = (Bit8u)uVar1;
  UpdateAttack(this,chip);
  UpdateDecay(this,chip);
  UpdateRelease(this,chip);
  return;
}

Assistant:

void Operator::UpdateRates( const Chip* chip ) {
	//Mame seems to reverse this where enabling ksr actually lowers
	//the rate, but pdf manuals says otherwise?
	Bit8u newKsr = (Bit8u)((chanData >> SHIFT_KEYCODE) & 0xff);
	if ( !( reg20 & MASK_KSR ) ) {
		newKsr >>= 2;
	}
	if ( ksr == newKsr )
		return;
	ksr = newKsr;
	UpdateAttack( chip );
	UpdateDecay( chip );
	UpdateRelease( chip );
}